

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gosthash.c
# Opt level: O0

int add_blocks(int n,byte *left,byte *right)

{
  int iVar1;
  int sum;
  int carry;
  int i;
  byte *right_local;
  byte *left_local;
  int n_local;
  
  carry = 0;
  for (i = 0; i < n; i = i + 1) {
    iVar1 = (uint)left[i] + (uint)right[i] + carry;
    left[i] = (byte)iVar1;
    carry = iVar1 >> 8;
  }
  return carry;
}

Assistant:

static int add_blocks(int n, byte * left, const byte * right)
{
    int i;
    int carry = 0;
    for (i = 0; i < n; i++) {
        int sum = (int)left[i] + (int)right[i] + carry;
        left[i] = sum & 0xff;
        carry = sum >> 8;
    }
    return carry;
}